

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void output_example_seq(vw *all,multi_ex *ec_seq)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  size_type sVar4;
  reference ppeVar5;
  reference ppeVar6;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  long *in_RDI;
  v_array<char> empty;
  example *ec;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  bool hit_loss;
  multi_ex *in_stack_000001f8;
  bool *in_stack_00000200;
  example *in_stack_00000208;
  vw *in_stack_00000210;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  allocator local_79;
  string local_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  example *local_38;
  example **local_30;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  undefined1 local_11;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  long *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar4 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  if (sVar4 != 0) {
    ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,0);
    *(double *)(*local_8 + 0x20) = (double)(*ppeVar5)->weight + *(double *)(*local_8 + 0x20);
    *(long *)(*local_8 + 8) = *(long *)(*local_8 + 8) + 1;
    local_11 = 0;
    local_20 = local_10;
    local_28._M_current =
         (example **)
         std::vector<example_*,_std::allocator<example_*>_>::begin
                   ((vector<example_*,_std::allocator<example_*>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    local_30 = (example **)
               std::vector<example_*,_std::allocator<example_*>_>::end
                         ((vector<example_*,_std::allocator<example_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
          bVar3) {
      ppeVar6 = __gnu_cxx::
                __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
                operator*(&local_28);
      local_38 = *ppeVar6;
      output_example(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
      __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
      ::operator++(&local_28);
    }
    if (0 < (int)local_8[0x6a6]) {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      pcVar1 = (code *)local_8[0x6a8];
      lVar2 = local_8[0x6a6];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"",&local_79);
      (*pcVar1)((int)lVar2,local_78);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
  }
  return;
}

Assistant:

void output_example_seq(vw& all, multi_ex& ec_seq)
{
  if (ec_seq.size() == 0) return;
  all.sd->weighted_labeled_examples += ec_seq[0]->weight;
  all.sd->example_number++;

  bool hit_loss = false;
  for (example* ec : ec_seq)
    output_example(all, *ec, hit_loss, &(ec_seq));

  if (all.raw_prediction > 0)
  {
    v_array<char> empty = { nullptr, nullptr, nullptr, 0 };
    all.print_text(all.raw_prediction, "", empty);
  }
}